

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  int iVar1;
  LogDestination *this;
  Mutex *pMVar2;
  LogMessageFatal local_58;
  MutexLock local_48;
  MutexLock l;
  MutexLock local_38;
  
  local_38.mu_ = local_38.mu_ & 0xffffffff00000000;
  local_58.super_LogMessage.allocated_._0_4_ = severity;
  if (severity < 0) {
    pMVar2 = (Mutex *)MakeCheckOpString<int,int>((int *)&local_58,(int *)&local_38,"severity >= 0");
    if (pMVar2 != (Mutex *)0x0) {
      local_38.mu_ = pMVar2;
      LogMessageFatal::LogMessageFatal
                (&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                 ,0x2a4,(CheckOpString *)&local_38);
      LogMessageFatal::~LogMessageFatal(&local_58);
    }
  }
  else {
    l.mu_._4_4_ = 4;
    l.mu_._0_4_ = severity;
    if (3 < (uint)severity) {
      SetLogSymlink();
    }
  }
  local_48.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar1 != 0) goto LAB_0011bdce;
  }
  if (3 < (uint)severity) {
    __assert_fail("severity >=0 && severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                  ,0x378,
                  "static LogDestination *google::LogDestination::log_destination(LogSeverity)");
  }
  this = (LogDestination *)(&log_destinations_)[(uint)severity];
  if (this == (LogDestination *)0x0) {
    this = (LogDestination *)operator_new(0xe8);
    LogDestination(this,severity,(char *)0x0);
    (&log_destinations_)[(uint)severity] = this;
  }
  local_38.mu_ = &(this->fileobject_).lock_;
  if ((this->fileobject_).lock_.is_safe_ == true) {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)local_38.mu_);
    if (iVar1 != 0) {
LAB_0011bdce:
      abort();
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(this->fileobject_).symlink_basename_,symlink_basename);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_38);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_48);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}